

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::Postprocess_BuildScene(AMFImporter *this,aiScene *pScene)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  bool bVar3;
  aiNode *paVar4;
  DeadlyImportError *this_00;
  _List_node_base **pp_Var5;
  reference ppCVar6;
  size_type sVar7;
  reference ppaVar8;
  aiNode **ppaVar9;
  reference ppaVar10;
  aiMesh **ppaVar11;
  reference ppaVar12;
  aiTexture **ppaVar13;
  reference pSVar14;
  aiTexture *this_01;
  aiMaterial **ppaVar15;
  aiMaterial *this_02;
  uint local_640 [2];
  int repeat;
  int mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f4 [8];
  aiString texture_id;
  SPP_Texture *tex_convd_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  *__range2_1;
  SPP_Texture *tex_convd;
  iterator __end2;
  iterator __begin2;
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
  *__range2;
  size_t idx;
  ulong local_1a0;
  size_t i_1;
  _List_const_iterator<aiMesh_*> local_190;
  const_iterator ml_it;
  ulong local_180;
  size_t i;
  _List_const_iterator<aiNode_*> local_170;
  const_iterator nl_it_1;
  const_iterator local_160;
  iterator local_158;
  _List_const_iterator<aiNode_*> local_150;
  _List_const_iterator<aiNode_*> local_148;
  const_iterator next_it;
  _Self local_138;
  iterator nl_it;
  CAMFImporter_NodeElement *root_child_2;
  iterator __end1_3;
  iterator __begin1_3;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1_3;
  aiNode *tnode;
  CAMFImporter_NodeElement *root_child_1;
  iterator __end1_2;
  iterator __begin1_2;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1_2;
  CAMFImporter_NodeElement *root_child;
  iterator __end1_1;
  iterator __begin1_1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1_1;
  string local_b8;
  CAMFImporter_NodeElement *local_98;
  CAMFImporter_NodeElement *ne;
  iterator __end1;
  iterator __begin1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1;
  CAMFImporter_NodeElement *root_el;
  undefined1 local_60 [8];
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
  meta_list;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> mesh_list;
  list<aiNode_*,_std::allocator<aiNode_*>_> node_list;
  aiScene *pScene_local;
  AMFImporter *this_local;
  
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::list
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
             &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
              _M_size);
  std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::list
            ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
             &meta_list.
              super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>::
  list((list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
        *)local_60);
  paVar4 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar4);
  pScene->mRootNode = paVar4;
  pScene->mRootNode->mParent = (aiNode *)0x0;
  pScene->mFlags = pScene->mFlags | 0x20;
  __range1 = (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)0x0;
  __end1 = std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                     (&this->mNodeElement_List);
  ne = (CAMFImporter_NodeElement *)
       std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
       end(&this->mNodeElement_List);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&ne),
        pCVar2 = (CAMFImporter_NodeElement *)__range1, bVar3) {
    ppCVar6 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1);
    local_98 = *ppCVar6;
    pCVar2 = local_98;
    if (local_98->Type == ENET_Root) break;
    std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1);
  }
  __range1 = (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)pCVar2
  ;
  if (__range1 ==
      (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)0x0) {
    __range1_1._6_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Root(<amf>) element not found.",
               (allocator<char> *)((long)&__range1_1 + 7));
    DeadlyImportError::DeadlyImportError(this_00,&local_b8);
    __range1_1._6_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pp_Var5 = &__range1[2].
             super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
  __end1_1 = std::__cxx11::
             list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                       ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                         *)pp_Var5);
  root_child = (CAMFImporter_NodeElement *)
               std::__cxx11::
               list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                         ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                           *)pp_Var5);
  while (bVar3 = std::operator!=(&__end1_1,(_Self *)&root_child), bVar3) {
    ppCVar6 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1_1);
    if ((*ppCVar6)->Type == ENET_Material) {
      Postprocess_BuildMaterial(this,(CAMFImporter_NodeElement_Material *)*ppCVar6);
    }
    std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1_1);
  }
  pp_Var5 = &__range1[2].
             super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
  __end1_2 = std::__cxx11::
             list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                       ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                         *)pp_Var5);
  root_child_1 = (CAMFImporter_NodeElement *)
                 std::__cxx11::
                 list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                           ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                             *)pp_Var5);
  while (bVar3 = std::operator!=(&__end1_2,(_Self *)&root_child_1), bVar3) {
    ppCVar6 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1_2);
    tnode = (aiNode *)*ppCVar6;
    if (*(EType *)((tnode->mName).data + 4) == ENET_Object) {
      __range1_3 = (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)
                   0x0;
      Postprocess_BuildNodeAndObject
                (this,(CAMFImporter_NodeElement_Object *)tnode,
                 (list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                 &meta_list.
                  super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                  ._M_impl._M_node._M_size,(aiNode **)&__range1_3);
      if (__range1_3 !=
          (list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *)0x0) {
        std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                   &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
                    _M_size,(value_type *)&__range1_3);
      }
    }
    std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1_2);
  }
  pp_Var5 = &__range1[2].
             super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
  __end1_3 = std::__cxx11::
             list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                       ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                         *)pp_Var5);
  root_child_2 = (CAMFImporter_NodeElement *)
                 std::__cxx11::
                 list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                           ((list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                             *)pp_Var5);
  while (bVar3 = std::operator!=(&__end1_3,(_Self *)&root_child_2), bVar3) {
    ppCVar6 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1_3);
    pCVar2 = *ppCVar6;
    if (pCVar2->Type == ENET_Constellation) {
      Postprocess_BuildConstellation
                (this,(CAMFImporter_NodeElement_Constellation *)pCVar2,
                 (list<aiNode_*,_std::allocator<aiNode_*>_> *)
                 &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
                  _M_size);
    }
    if (pCVar2->Type == ENET_Metadata) {
      nl_it._M_node = (_List_node_base *)pCVar2;
      std::__cxx11::
      list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
      ::push_back((list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                   *)local_60,(value_type *)&nl_it);
    }
    std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1_3);
  }
  Postprocess_AddMetadata
            (this,(list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                   *)local_60,pScene->mRootNode);
LAB_005d3925:
  sVar7 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                    ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                     &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      _M_node._M_size);
  if (1 < sVar7) {
    local_138._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                   ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                    &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node
                     ._M_size);
    while( true ) {
      next_it._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end
                     ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                      &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       _M_node._M_size);
      bVar3 = std::operator!=(&local_138,(_Self *)&next_it);
      if (!bVar3) break;
      std::_List_const_iterator<aiNode_*>::_List_const_iterator(&local_148,&local_138);
      std::_List_const_iterator<aiNode_*>::operator++(&local_148);
      while( true ) {
        local_158._M_node =
             (_List_node_base *)
             std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end
                       ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                        &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         _M_node._M_size);
        std::_List_const_iterator<aiNode_*>::_List_const_iterator(&local_150,&local_158);
        bVar3 = std::operator!=(&local_148,&local_150);
        if (!bVar3) break;
        ppaVar10 = std::_List_const_iterator<aiNode_*>::operator*(&local_148);
        paVar4 = *ppaVar10;
        ppaVar8 = std::_List_iterator<aiNode_*>::operator*(&local_138);
        paVar4 = aiNode::FindNode(paVar4,&(*ppaVar8)->mName);
        if (paVar4 != (aiNode *)0x0) {
          std::_List_const_iterator<aiNode_*>::_List_const_iterator(&local_160,&local_138);
          nl_it_1._M_node =
               (_List_node_base *)
               std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase
                         ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                          &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           _M_node._M_size,local_160);
          goto LAB_005d3925;
        }
        std::_List_const_iterator<aiNode_*>::operator++(&local_148);
      }
      std::_List_iterator<aiNode_*>::operator++(&local_138);
    }
  }
  bVar3 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                    ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                     &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      _M_node._M_size);
  if (!bVar3) {
    psVar1 = &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
              _M_size;
    i = (size_t)std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                          ((list<aiNode_*,_std::allocator<aiNode_*>_> *)psVar1);
    std::_List_const_iterator<aiNode_*>::_List_const_iterator(&local_170,(iterator *)&i);
    sVar7 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                      ((list<aiNode_*,_std::allocator<aiNode_*>_> *)psVar1);
    pScene->mRootNode->mNumChildren = (uint)sVar7;
    ppaVar9 = (aiNode **)operator_new__((ulong)pScene->mRootNode->mNumChildren << 3);
    pScene->mRootNode->mChildren = ppaVar9;
    for (local_180 = 0; local_180 < pScene->mRootNode->mNumChildren; local_180 = local_180 + 1) {
      paVar4 = pScene->mRootNode;
      ppaVar10 = std::_List_const_iterator<aiNode_*>::operator*(&local_170);
      (*ppaVar10)->mParent = paVar4;
      ml_it._M_node =
           (_List_node_base *)std::_List_const_iterator<aiNode_*>::operator++(&local_170,0);
      ppaVar10 = std::_List_const_iterator<aiNode_*>::operator*
                           ((_List_const_iterator<aiNode_*> *)&ml_it);
      pScene->mRootNode->mChildren[local_180] = *ppaVar10;
    }
  }
  bVar3 = std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::empty
                    ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                     &meta_list.
                      super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
                      ._M_impl._M_node._M_size);
  if (!bVar3) {
    psVar1 = &meta_list.
              super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
              ._M_impl._M_node._M_size;
    i_1 = (size_t)std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                            ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)psVar1);
    std::_List_const_iterator<aiMesh_*>::_List_const_iterator(&local_190,(iterator *)&i_1);
    sVar7 = std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)psVar1);
    pScene->mNumMeshes = (uint)sVar7;
    ppaVar11 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
    pScene->mMeshes = ppaVar11;
    for (local_1a0 = 0; local_1a0 < pScene->mNumMeshes; local_1a0 = local_1a0 + 1) {
      idx = (size_t)std::_List_const_iterator<aiMesh_*>::operator++(&local_190,0);
      ppaVar12 = std::_List_const_iterator<aiMesh_*>::operator*
                           ((_List_const_iterator<aiMesh_*> *)&idx);
      pScene->mMeshes[local_1a0] = *ppaVar12;
    }
  }
  sVar7 = std::__cxx11::
          list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
          ::size(&this->mTexture_Converted);
  pScene->mNumTextures = (uint)sVar7;
  if (pScene->mNumTextures != 0) {
    __range2 = (list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                *)0x0;
    ppaVar13 = (aiTexture **)operator_new__((ulong)pScene->mNumTextures << 3);
    pScene->mTextures = ppaVar13;
    __end2 = std::__cxx11::
             list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
             ::begin(&this->mTexture_Converted);
    tex_convd = (SPP_Texture *)
                std::__cxx11::
                list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                ::end(&this->mTexture_Converted);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&tex_convd), bVar3) {
      pSVar14 = std::_List_iterator<Assimp::AMFImporter::SPP_Texture>::operator*(&__end2);
      this_01 = (aiTexture *)operator_new(0x428);
      aiTexture::aiTexture(this_01);
      pScene->mTextures[(long)__range2] = this_01;
      pScene->mTextures[(long)__range2]->mWidth = (uint)pSVar14->Width;
      pScene->mTextures[(long)__range2]->mHeight = (uint)pSVar14->Height;
      pScene->mTextures[(long)__range2]->pcData = (aiTexel *)pSVar14->Data;
      strcpy(pScene->mTextures[(long)__range2]->achFormatHint,pSVar14->FormatHint);
      __range2 = (list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                  *)((long)&(__range2->
                            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                            )._M_impl._M_node.super__List_node_base._M_next + 1);
      std::_List_iterator<Assimp::AMFImporter::SPP_Texture>::operator++(&__end2);
    }
    __range2 = (list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                *)0x0;
    sVar7 = std::__cxx11::
            list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
            ::size(&this->mTexture_Converted);
    pScene->mNumMaterials = (uint)sVar7;
    ppaVar15 = (aiMaterial **)operator_new__((ulong)pScene->mNumMaterials << 3);
    pScene->mMaterials = ppaVar15;
    __end2_1 = std::__cxx11::
               list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
               ::begin(&this->mTexture_Converted);
    tex_convd_1 = (SPP_Texture *)
                  std::__cxx11::
                  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                  ::end(&this->mTexture_Converted);
    while (bVar3 = std::operator!=(&__end2_1,(_Self *)&tex_convd_1), bVar3) {
      texture_id.data._1016_8_ =
           std::_List_iterator<Assimp::AMFImporter::SPP_Texture>::operator*(&__end2_1);
      to_string<unsigned_long>((string *)&repeat,(unsigned_long)__range2);
      std::operator+(&local_618,"*",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&repeat);
      aiString::aiString((aiString *)local_5f4,&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&repeat);
      local_640[1] = 0;
      local_640[0] = *(byte *)(texture_id.data._1016_8_ + 0x38) & 1;
      this_02 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_02);
      pScene->mMaterials[(long)__range2] = this_02;
      aiMaterial::AddProperty
                (pScene->mMaterials[(long)__range2],(aiString *)local_5f4,"$tex.file",1,0);
      aiMaterial::AddProperty
                (pScene->mMaterials[(long)__range2],(int *)(local_640 + 1),1,"$tex.op",1,0);
      aiMaterial::AddProperty
                (pScene->mMaterials[(long)__range2],(int *)local_640,1,"$tex.mapmodeu",1,0);
      aiMaterial::AddProperty
                (pScene->mMaterials[(long)__range2],(int *)local_640,1,"$tex.mapmodev",1,0);
      __range2 = (list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                  *)((long)&(__range2->
                            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
                            )._M_impl._M_node.super__List_node_base._M_next + 1);
      std::_List_iterator<Assimp::AMFImporter::SPP_Texture>::operator++(&__end2_1);
    }
  }
  std::__cxx11::
  list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>::
  ~list((list<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
         *)local_60);
  std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::~list
            ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)
             &meta_list.
              super__List_base<CAMFImporter_NodeElement_Metadata_*,_std::allocator<CAMFImporter_NodeElement_Metadata_*>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::~list
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
             &mesh_list.super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl._M_node.
              _M_size);
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildScene(aiScene* pScene)
{
std::list<aiNode*> node_list;
std::list<aiMesh*> mesh_list;
std::list<CAMFImporter_NodeElement_Metadata*> meta_list;

	//
	// Because for AMF "material" is just complex colors mixing so aiMaterial will not be used.
	// For building aiScene we are must to do few steps:
	// at first creating root node for aiScene.
	pScene->mRootNode = new aiNode;
	pScene->mRootNode->mParent = nullptr;
	pScene->mFlags |= AI_SCENE_FLAGS_ALLOW_SHARED;
	// search for root(<amf>) element
	CAMFImporter_NodeElement* root_el = nullptr;

	for(CAMFImporter_NodeElement* ne: mNodeElement_List)
	{
		if(ne->Type != CAMFImporter_NodeElement::ENET_Root) continue;

		root_el = ne;

		break;
	}// for(const CAMFImporter_NodeElement* ne: mNodeElement_List)

	// Check if root element are found.
	if(root_el == nullptr) throw DeadlyImportError("Root(<amf>) element not found.");

	// after that walk through children of root and collect data. Five types of nodes can be placed at top level - in <amf>: <object>, <material>, <texture>,
	// <constellation> and <metadata>. But at first we must read <material> and <texture> because they will be used in <object>. <metadata> can be read
	// at any moment.
	//
	// 1. <material>
	// 2. <texture> will be converted later when processing triangles list. \sa Postprocess_BuildMeshSet
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Material) Postprocess_BuildMaterial(*((CAMFImporter_NodeElement_Material*)root_child));
	}

	// After "appearance" nodes we must read <object> because it will be used in <constellation> -> <instance>.
	//
	// 3. <object>
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Object)
		{
			aiNode* tnode = nullptr;

			// for <object> mesh and node must be built: object ID assigned to aiNode name and will be used in future for <instance>
			Postprocess_BuildNodeAndObject(*((CAMFImporter_NodeElement_Object*)root_child), mesh_list, &tnode);
			if(tnode != nullptr) node_list.push_back(tnode);

		}
	}// for(const CAMFImporter_NodeElement* root_child: root_el->Child)

	// And finally read rest of nodes.
	//
	for(const CAMFImporter_NodeElement* root_child: root_el->Child)
	{
		// 4. <constellation>
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Constellation)
		{
			// <object> and <constellation> at top of self abstraction use aiNode. So we can use only aiNode list for creating new aiNode's.
			Postprocess_BuildConstellation(*((CAMFImporter_NodeElement_Constellation*)root_child), node_list);
		}

		// 5, <metadata>
		if(root_child->Type == CAMFImporter_NodeElement::ENET_Metadata) meta_list.push_back((CAMFImporter_NodeElement_Metadata*)root_child);
	}// for(const CAMFImporter_NodeElement* root_child: root_el->Child)

	// at now we can add collected metadata to root node
	Postprocess_AddMetadata(meta_list, *pScene->mRootNode);
	//
	// Check constellation children
	//
	// As said in specification:
	// "When multiple objects and constellations are defined in a single file, only the top level objects and constellations are available for printing."
	// What that means? For example: if some object is used in constellation then you must show only constellation but not original object.
	// And at this step we are checking that relations.
nl_clean_loop:

	if(node_list.size() > 1)
	{
		// walk through all nodes
		for(std::list<aiNode*>::iterator nl_it = node_list.begin(); nl_it != node_list.end(); ++nl_it)
		{
			// and try to find them in another top nodes.
			std::list<aiNode*>::const_iterator next_it = nl_it;

			++next_it;
			for(; next_it != node_list.end(); ++next_it)
			{
				if((*next_it)->FindNode((*nl_it)->mName) != nullptr)
				{
					// if current top node(nl_it) found in another top node then erase it from node_list and restart search loop.
					node_list.erase(nl_it);

					goto nl_clean_loop;
				}
			}// for(; next_it != node_list.end(); next_it++)
		}// for(std::list<aiNode*>::const_iterator nl_it = node_list.begin(); nl_it != node_list.end(); nl_it++)
	}

	//
	// move created objects to aiScene
	//
	//
	// Nodes
	if(!node_list.empty())
	{
		std::list<aiNode*>::const_iterator nl_it = node_list.begin();

		pScene->mRootNode->mNumChildren = static_cast<unsigned int>(node_list.size());
		pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];
		for(size_t i = 0; i < pScene->mRootNode->mNumChildren; i++)
		{
			// Objects and constellation that must be showed placed at top of hierarchy in <amf> node. So all aiNode's in node_list must have
			// mRootNode only as parent.
			(*nl_it)->mParent = pScene->mRootNode;
			pScene->mRootNode->mChildren[i] = *nl_it++;
		}
	}// if(node_list.size() > 0)

	//
	// Meshes
	if(!mesh_list.empty())
	{
		std::list<aiMesh*>::const_iterator ml_it = mesh_list.begin();

		pScene->mNumMeshes = static_cast<unsigned int>(mesh_list.size());
		pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
		for(size_t i = 0; i < pScene->mNumMeshes; i++) pScene->mMeshes[i] = *ml_it++;
	}// if(mesh_list.size() > 0)

	//
	// Textures
	pScene->mNumTextures = static_cast<unsigned int>(mTexture_Converted.size());
	if(pScene->mNumTextures > 0)
	{
		size_t idx;

		idx = 0;
		pScene->mTextures = new aiTexture*[pScene->mNumTextures];
		for(const SPP_Texture& tex_convd: mTexture_Converted)
		{
			pScene->mTextures[idx] = new aiTexture;
			pScene->mTextures[idx]->mWidth = static_cast<unsigned int>(tex_convd.Width);
			pScene->mTextures[idx]->mHeight = static_cast<unsigned int>(tex_convd.Height);
			pScene->mTextures[idx]->pcData = (aiTexel*)tex_convd.Data;
			// texture format description.
			strcpy(pScene->mTextures[idx]->achFormatHint, tex_convd.FormatHint);
			idx++;
		}// for(const SPP_Texture& tex_convd: mTexture_Converted)

		// Create materials for embedded textures.
		idx = 0;
		pScene->mNumMaterials = static_cast<unsigned int>(mTexture_Converted.size());
		pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
		for(const SPP_Texture& tex_convd: mTexture_Converted)
		{
			const aiString texture_id(AI_EMBEDDED_TEXNAME_PREFIX + to_string(idx));
			const int mode = aiTextureOp_Multiply;
			const int repeat = tex_convd.Tiled ? 1 : 0;

			pScene->mMaterials[idx] = new aiMaterial;
			pScene->mMaterials[idx]->AddProperty(&texture_id, AI_MATKEY_TEXTURE_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&mode, 1, AI_MATKEY_TEXOP_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&repeat, 1, AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
			pScene->mMaterials[idx]->AddProperty(&repeat, 1, AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
			idx++;
		}
	}// if(pScene->mNumTextures > 0)
}